

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O2

int32_t __thiscall
cornelich::vanilla_index::last_index_file_number
          (vanilla_index *this,int32_t cycle,int32_t default_cycle)

{
  type_conflict tVar1;
  bool bVar2;
  int iVar3;
  directory_iterator local_f8;
  directory_iterator __end1;
  directory_iterator __begin1;
  directory_iterator local_e0;
  directory_iterator end;
  directory_iterator begin;
  iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
  local_c0;
  int32_t index;
  string_type name;
  error_code err;
  path path;
  
  std::__cxx11::string::string((string *)&name,(string *)this->m_settings);
  cycle_formatter::date_from_cycle_abi_cxx11_
            ((string *)&err,
             (this->m_settings->m_cycle_format).
             super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (long)cycle);
  std::__cxx11::string::string((string *)&index,(string *)&err);
  boost::filesystem::operator/(&path,(path *)&name,(path *)&index);
  std::__cxx11::string::~string((string *)&index);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::~string((string *)&name);
  err.val_ = 0;
  err.failed_ = false;
  err.cat_ = boost::system::system_category();
  boost::filesystem::directory_iterator::directory_iterator(&begin,&path,&err);
  end.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  local_e0 = (directory_iterator)(directory_iterator)begin.m_imp.px;
  if (begin.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)begin.m_imp.px = *(int *)begin.m_imp.px + 1;
    UNLOCK();
  }
  local_f8.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  boost::make_iterator_range<boost::filesystem::directory_iterator>
            ((boost *)&local_c0,&local_e0,&local_f8);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_f8.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_e0.m_imp);
  __begin1.m_imp.px =
       (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
       (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_c0.m_Begin;
  if (local_c0.m_Begin.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_c0.m_Begin.m_imp.px = *(int *)local_c0.m_Begin.m_imp.px + 1;
    UNLOCK();
  }
  __end1.m_imp.px =
       (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
       (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_c0.m_End;
  if (local_c0.m_End.m_imp.px != (dir_itr_imp *)0x0) {
    LOCK();
    *(int *)local_c0.m_End.m_imp.px = *(int *)local_c0.m_End.m_imp.px + 1;
    UNLOCK();
  }
  iVar3 = -1;
  while (tVar1 = boost::iterators::operator!=
                           ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)&__begin1,
                            (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)&__end1), tVar1) {
    boost::filesystem::directory_iterator::dereference(&__begin1);
    boost::filesystem::path::filename();
    std::__cxx11::string::string((string *)&name,(string *)&index);
    std::__cxx11::string::~string((string *)&index);
    bVar2 = boost::algorithm::
            starts_with<std::__cxx11::string,std::__cxx11::string,boost::algorithm::is_equal>
                      (&name,INDEX_FILE_NAME_PREFIX_abi_cxx11_);
    if (bVar2) {
      index = -1;
      util::parse_number<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(name._M_dataplus._M_p + INDEX_FILE_NAME_PREFIX_abi_cxx11_._8_8_ + -1),
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(name._M_dataplus._M_p + name._M_string_length),(int *)&index);
      if (iVar3 <= index) {
        iVar3 = index;
      }
    }
    std::__cxx11::string::~string((string *)&name);
    boost::filesystem::directory_iterator::increment(&__begin1);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&__end1.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&__begin1.m_imp);
  boost::iterator_range_detail::
  iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
  ::~iterator_range_base(&local_c0);
  if (iVar3 != -1) {
    default_cycle = iVar3;
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&end.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&begin.m_imp);
  std::__cxx11::string::~string((string *)&path);
  return default_cycle;
}

Assistant:

std::int32_t vanilla_index::last_index_file_number(std::int32_t cycle, std::int32_t default_cycle) const
{
    std::int32_t last_number = -1;
    const auto path = fs::path(m_settings.path()) / m_settings.cycle_format().date_from_cycle(cycle);

    boost::system::error_code err;
    fs::directory_iterator begin(path, err);
    fs::directory_iterator end;

    // Find the last index file in the specified cycle directory
    for(const auto & entry : boost::make_iterator_range(begin, end))
    {
        auto name = entry.path().filename().native();
        if(boost::algorithm::starts_with(name, INDEX_FILE_NAME_PREFIX))
        {
            std::int32_t index = -1;
            util::parse_number(name.begin() + static_cast<std::string::difference_type>(INDEX_FILE_NAME_PREFIX.size()) - 1, name.end(), index);
            if(last_number < index)
                last_number = index;
        }
    }
    return last_number == -1 ? default_cycle : last_number;
}